

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront_workitems_soa.h
# Opt level: O0

GetBSSRDFAndProbeRayWorkItem * __thiscall
pbrt::SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>::operator[]
          (SOA<pbrt::GetBSSRDFAndProbeRayWorkItem> *this,int i)

{
  undefined8 uVar1;
  ulong uVar2;
  Tuple2<pbrt::Point2,_float> TVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int in_EDX;
  SOA<pbrt::Point3<float>_> *in_RSI;
  GetBSSRDFAndProbeRayWorkItem *in_RDI;
  undefined1 auVar14 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined8 in_XMM1_Qb;
  Point3f PVar15;
  Vector3f VVar16;
  Normal3f NVar17;
  SampledSpectrum SVar18;
  GetBSSRDFAndProbeRayWorkItem *r;
  MediumInterface *in_stack_fffffffffffffed8;
  GetBSSRDFAndProbeRayWorkItem *this_00;
  SOA<pbrt::MediumInterface> *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff08;
  int i_00;
  SOA<pbrt::SampledSpectrum> *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff2c;
  SOA<pbrt::SampledWavelengths> *in_stack_ffffffffffffff30;
  undefined8 local_34;
  ulong uStack_2c;
  undefined8 uStack_24;
  undefined8 uStack_1c;
  undefined1 extraout_var [56];
  
  i_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  this_00 = in_RDI;
  GetBSSRDFAndProbeRayWorkItem::GetBSSRDFAndProbeRayWorkItem(in_RDI);
  Material::operator=(&in_RDI->material,(Material *)in_stack_fffffffffffffed8);
  SOA<pbrt::SampledWavelengths>::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  *(undefined8 *)(in_RDI->lambda).lambda.values = local_34;
  *(ulong *)((in_RDI->lambda).lambda.values + 2) = uStack_2c;
  *(undefined8 *)(in_RDI->lambda).pdf.values = uStack_24;
  *(undefined8 *)((in_RDI->lambda).pdf.values + 2) = uStack_1c;
  auVar14 = ZEXT856(uStack_2c);
  SVar18 = SOA<pbrt::SampledSpectrum>::operator[](in_stack_ffffffffffffff10,i_00);
  auVar6._0_8_ = SVar18.values.values._0_8_;
  auVar6._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = SVar18.values.values._8_8_;
  uVar2 = vmovlpd_avx(auVar4);
  auVar14 = ZEXT856(uVar2);
  *(undefined8 *)(in_RDI->beta).values.values = uVar1;
  *(ulong *)((in_RDI->beta).values.values + 2) = uVar2;
  SVar18 = SOA<pbrt::SampledSpectrum>::operator[](in_stack_ffffffffffffff10,i_00);
  auVar7._0_8_ = SVar18.values.values._0_8_;
  auVar7._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = SVar18.values.values._8_8_;
  uVar2 = vmovlpd_avx(auVar5);
  auVar14 = ZEXT856(uVar2);
  *(undefined8 *)(in_RDI->r_u).values.values = uVar1;
  *(ulong *)((in_RDI->r_u).values.values + 2) = uVar2;
  PVar15 = SOA<pbrt::Point3<float>_>::operator[](in_RSI,(int)((ulong)this_00 >> 0x20));
  auVar8._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  (in_RDI->p).super_Tuple3<pbrt::Point3,_float>.z = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  (in_RDI->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (in_RDI->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar16 = SOA<pbrt::Vector3<float>_>::operator[]
                     ((SOA<pbrt::Vector3<float>_> *)in_RSI,(int)((ulong)this_00 >> 0x20));
  auVar9._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  NVar17 = SOA<pbrt::Normal3<float>_>::operator[]
                     ((SOA<pbrt::Normal3<float>_> *)in_RSI,(int)((ulong)this_00 >> 0x20));
  auVar10._0_8_ = NVar17.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar10._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar10._0_16_);
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.z = NVar17.super_Tuple3<pbrt::Normal3,_float>.z;
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  NVar17 = SOA<pbrt::Normal3<float>_>::operator[]
                     ((SOA<pbrt::Normal3<float>_> *)in_RSI,(int)((ulong)this_00 >> 0x20));
  auVar11._0_8_ = NVar17.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar11._0_16_);
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.z = NVar17.super_Tuple3<pbrt::Normal3,_float>.z;
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar16 = SOA<pbrt::Vector3<float>_>::operator[]
                     ((SOA<pbrt::Vector3<float>_> *)in_RSI,(int)((ulong)this_00 >> 0x20));
  auVar12._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar12._0_16_);
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar13._0_8_ =
       SOA<pbrt::Point2<float>_>::operator[]
                 ((SOA<pbrt::Point2<float>_> *)this_00,(int)((ulong)in_RDI >> 0x20));
  auVar13._8_56_ = extraout_var;
  TVar3 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar13._0_16_);
  (in_RDI->uv).super_Tuple2<pbrt::Point2,_float> = TVar3;
  in_RDI->depth = *(int *)(*(long *)((SOA<pbrt::Vector3<float>_> *)in_RSI + 9) + (long)in_EDX * 4);
  SOA<pbrt::MediumInterface>::operator[](in_stack_fffffffffffffef8,(int)((ulong)in_RSI >> 0x20));
  MediumInterface::operator=((MediumInterface *)in_RDI,in_stack_fffffffffffffed8);
  in_RDI->etaScale =
       *(Float *)(*(long *)((SOA<pbrt::Vector3<float>_> *)in_RSI + 10) + (long)in_EDX * 4);
  in_RDI->pixelIndex = (int)((SOA<pbrt::Vector3<float>_> *)in_RSI)[10].x[in_EDX];
  return this_00;
}

Assistant:

operator[](int i) const {
        DCHECK_LT(i, nAlloc);
        GetBSSRDFAndProbeRayWorkItem r;
        r.material = this->material[i];
        r.lambda = this->lambda[i];
        r.beta = this->beta[i];
        r.r_u = this->r_u[i];
        r.p = this->p[i];
        r.wo = this->wo[i];
        r.n = this->n[i];
        r.ns = this->ns[i];
        r.dpdus = this->dpdus[i];
        r.uv = this->uv[i];
        r.depth = this->depth[i];
        r.mediumInterface = this->mediumInterface[i];
        r.etaScale = this->etaScale[i];
        r.pixelIndex = this->pixelIndex[i];
        return r;
    }